

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

Section * getSection(char *name,SectionType type,uint32_t org,SectionSpec *attrs,SectionModifier mod
                    )

{
  ushort uVar1;
  SectionType SVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  Section *pSVar7;
  FileStackNode *pFVar8;
  uint8_t *puVar9;
  int *piVar10;
  char *pcVar11;
  uint uVar12;
  char *fmt;
  code *pcVar13;
  byte bVar14;
  ulong uVar15;
  bool bVar16;
  
  uVar3 = (ulong)type;
  uVar12 = attrs->bank;
  bVar14 = attrs->alignment;
  uVar1 = attrs->alignOfs;
  uVar15 = (ulong)uVar1;
  if (uVar12 == 0xffffffff) {
    uVar12 = 0xffffffff;
    if (sectionTypeInfo[uVar3].lastBank == sectionTypeInfo[uVar3].firstBank) {
      uVar12 = sectionTypeInfo[uVar3].firstBank;
    }
  }
  else if ((type & ~SECTTYPE_HRAM) - SECTTYPE_ROM0 < 0xfffffffe) {
    error("BANK only allowed for ROMX, WRAMX, SRAM, or VRAM sections\n");
  }
  else if ((uVar12 < sectionTypeInfo[uVar3].firstBank) || (sectionTypeInfo[uVar3].lastBank < uVar12)
          ) {
    error("%s bank value $%04x out of range ($%04x to $%04x)\n",sectionTypeInfo[uVar3].name,
          (ulong)uVar12,(ulong)sectionTypeInfo[uVar3].firstBank,
          (ulong)sectionTypeInfo[uVar3].lastBank);
  }
  if (1 << (bVar14 & 0x1f) <= (int)(uint)uVar1) {
    uVar1 = 0;
    error("Alignment offset (%u) must be smaller than alignment size (%u)\n",uVar15);
  }
  if ((org != 0xffffffff) &&
     ((org < sectionTypeInfo[uVar3].startAddr ||
      (((ushort)(sectionTypeInfo[uVar3].startAddr + sectionTypeInfo[uVar3].size) - 1 & 0xffff) < org
      )))) {
    error("Section \"%s\"\'s fixed address $%04x is outside of range [$%04x; $%04x]\n",name,
          (ulong)org,(ulong)sectionTypeInfo[uVar3].startAddr,
          (ulong)((ushort)(sectionTypeInfo[uVar3].startAddr + sectionTypeInfo[uVar3].size) - 1 &
                 0xffff));
  }
  if (bVar14 != 0) {
    if (0x10 < bVar14) {
      error("Alignment must be between 0 and 16, not %u\n",(ulong)bVar14);
      bVar14 = 0x10;
    }
    uVar4 = ~(-1 << (bVar14 & 0x1f));
    if (org == 0xffffffff) {
      if ((sectionTypeInfo[uVar3].startAddr & uVar4) == 0) {
        bVar16 = bVar14 != 0x10;
        if (!bVar16) {
          bVar14 = 0;
        }
        org = -(uint)bVar16;
      }
      else {
        bVar14 = 0;
        error("Section \"%s\"\'s alignment cannot be attained in %s\n",name,
              sectionTypeInfo[uVar3].name);
        org = 0;
      }
    }
    else if ((org - uVar1 & uVar4) == 0) {
      bVar14 = 0;
    }
    else {
      bVar14 = 0;
      error("Section \"%s\"\'s fixed address doesn\'t match its alignment\n",name);
    }
  }
  pSVar7 = sect_FindSectionByName(name);
  if (pSVar7 != (Section *)0x0) {
    SVar2 = pSVar7->type;
    if (SVar2 != type) {
      error("Section already exists but with type %s\n",sectionTypeInfo[SVar2].name);
    }
    uVar4 = (uint)(SVar2 != type);
    if (pSVar7->modifier == mod) {
      if (mod - SECTION_UNION < 2) {
        pcVar13 = mergeFragments;
        if (mod == SECTION_UNION) {
          pcVar13 = mergeSectUnion;
        }
        iVar5 = (*pcVar13)(pSVar7,uVar3,org,bVar14,uVar1);
        uVar4 = iVar5 + uVar4;
        if (pSVar7->bank == 0xffffffff) {
          pSVar7->bank = uVar12;
        }
        else if (pSVar7->bank != uVar12 && uVar12 != 0xffffffff) {
          error("Section already declared with different bank %u\n");
          uVar4 = uVar4 + 1;
        }
      }
      else if (mod == SECTION_NORMAL) {
        error("Section already defined previously at ");
        uVar4 = uVar4 + 1;
        fstk_Dump(pSVar7->src,pSVar7->fileLine);
        putc(10,_stderr);
      }
    }
    else {
      error("Section already declared as %s section\n",sectionModNames[pSVar7->modifier]);
      uVar4 = uVar4 + 1;
    }
    if (uVar4 == 0) {
      return pSVar7;
    }
    pcVar11 = "s";
    if (uVar4 == 1) {
      pcVar11 = "";
    }
    fatalerror("Cannot create section \"%s\" (%u error%s)\n",pSVar7->name,(ulong)uVar4,pcVar11);
  }
  pSVar7 = (Section *)malloc(0x48);
  if (pSVar7 != (Section *)0x0) {
    pcVar11 = strdup(name);
    pSVar7->name = pcVar11;
    if (pcVar11 == (char *)0x0) {
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      fmt = "Not enough memory for section name: %s\n";
      goto LAB_00112bd0;
    }
    pSVar7->type = type;
    pSVar7->modifier = mod;
    pFVar8 = fstk_GetFileStack();
    pSVar7->src = pFVar8;
    uVar6 = lexer_GetLineNo();
    pSVar7->fileLine = uVar6;
    pSVar7->size = 0;
    pSVar7->org = org;
    pSVar7->bank = uVar12;
    pSVar7->align = bVar14;
    pSVar7->alignOfs = uVar1;
    pSVar7->next = (Section *)0x0;
    pSVar7->patches = (Patch *)0x0;
    if (type == SECTTYPE_INVALID) {
      __assert_fail("type != SECTTYPE_INVALID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                    ,0x65,"bool sect_HasData(enum SectionType)");
    }
    if ((type & ~SECTTYPE_VRAM) != SECTTYPE_ROMX) {
      pSVar7->data = (uint8_t *)0x0;
LAB_00112b56:
      pSVar7->next = sectionList;
      sectionList = pSVar7;
      return pSVar7;
    }
    puVar9 = (uint8_t *)malloc((ulong)sectionTypeInfo[uVar3].size);
    pSVar7->data = puVar9;
    if (puVar9 != (uint8_t *)0x0) goto LAB_00112b56;
  }
  piVar10 = __errno_location();
  pcVar11 = strerror(*piVar10);
  fmt = "Not enough memory for section: %s\n";
LAB_00112bd0:
  fatalerror(fmt,pcVar11);
}

Assistant:

static struct Section *getSection(char const *name, enum SectionType type, uint32_t org,
				  struct SectionSpec const *attrs, enum SectionModifier mod)
{
	uint32_t bank = attrs->bank;
	uint8_t alignment = attrs->alignment;
	uint16_t alignOffset = attrs->alignOfs;

	// First, validate parameters, and normalize them if applicable

	if (bank != (uint32_t)-1) {
		if (type != SECTTYPE_ROMX && type != SECTTYPE_VRAM
		 && type != SECTTYPE_SRAM && type != SECTTYPE_WRAMX)
			error("BANK only allowed for ROMX, WRAMX, SRAM, or VRAM sections\n");
		else if (bank < sectionTypeInfo[type].firstBank || bank > sectionTypeInfo[type].lastBank)
			error("%s bank value $%04" PRIx32 " out of range ($%04" PRIx32 " to $%04"
				PRIx32 ")\n", sectionTypeInfo[type].name, bank,
				sectionTypeInfo[type].firstBank, sectionTypeInfo[type].lastBank);
	} else if (nbbanks(type) == 1) {
		// If the section type only has a single bank, implicitly force it
		bank = sectionTypeInfo[type].firstBank;
	}

	if (alignOffset >= 1 << alignment) {
		error("Alignment offset (%" PRIu16 ") must be smaller than alignment size (%u)\n",
		      alignOffset, 1U << alignment);
		alignOffset = 0;
	}

	if (org != (uint32_t)-1) {
		if (org < sectionTypeInfo[type].startAddr || org > endaddr(type))
			error("Section \"%s\"'s fixed address $%04" PRIx32
				" is outside of range [$%04" PRIx16 "; $%04" PRIx16 "]\n",
				name, org, sectionTypeInfo[type].startAddr, endaddr(type));
	}

	if (alignment != 0) {
		if (alignment > 16) {
			error("Alignment must be between 0 and 16, not %u\n", alignment);
			alignment = 16;
		}
		// It doesn't make sense to have both alignment and org set
		uint32_t mask = mask(alignment);

		if (org != (uint32_t)-1) {
			if ((org - alignOffset) & mask)
				error("Section \"%s\"'s fixed address doesn't match its alignment\n",
					name);
			alignment = 0; // Ignore it if it's satisfied
		} else if (sectionTypeInfo[type].startAddr & mask) {
			error("Section \"%s\"'s alignment cannot be attained in %s\n",
				name, sectionTypeInfo[type].name);
			alignment = 0; // Ignore it if it's unattainable
			org = 0;
		} else if (alignment == 16) {
			// Treat an alignment of 16 as being fixed at address 0
			alignment = 0;
			org = 0;
			// The address is known to be valid, since the alignment is
		}
	}

	// Check if another section exists with the same name; merge if yes, otherwise create one

	struct Section *sect = sect_FindSectionByName(name);

	if (sect) {
		mergeSections(sect, type, org, bank, alignment, alignOffset, mod);
	} else {
		sect = createSection(name, type, org, bank, alignment, alignOffset, mod);
		// Add the new section to the list (order doesn't matter)
		sect->next = sectionList;
		sectionList = sect;
	}

	return sect;
}